

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_attributes_uint64(void *a,uint64_t **attrib)

{
  uint *puVar1;
  uint nr_of_indices;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  uint8_t *b5;
  uint8_t *b6;
  uint8_t *b7;
  uint8_t *b8;
  ulong __size;
  uint64_t sz;
  ulong uVar7;
  
  if ((*(int *)((long)a + 0x24) == 0x14) && (*(int *)((long)a + 0x40) == 0)) {
    lVar2 = *(long *)((long)a + 0x10);
    puVar3 = *(uint **)((long)a + 0x18);
    uVar4 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
      nr_of_indices = *puVar3;
      __size = (ulong)nr_of_indices;
      *(uint **)((long)a + 0x18) = puVar3 + 1;
      if ((ulong)((long)(puVar3 + 1) + (4 - lVar2)) <= uVar4) {
        uVar5 = puVar3[1];
        uVar7 = (ulong)uVar5;
        puVar1 = puVar3 + 2;
        *(uint **)((long)a + 0x18) = puVar1;
        pcVar6 = (char *)malloc(uVar7);
        if ((long)puVar3 + ((uVar7 + 8) - lVar2) <= uVar4) {
          memcpy(pcVar6,puVar1,uVar7);
          *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
          b1 = (uint8_t *)malloc(__size);
          uVar5 = LZ4_decompress_safe(pcVar6,(char *)b1,uVar5,nr_of_indices);
          if (uVar5 != nr_of_indices) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x633,"int trico_read_attributes_uint64(void *, uint64_t **)");
          }
          if (*(int *)((long)a + 0x40) == 0) {
            lVar2 = *(long *)((long)a + 0x10);
            puVar3 = *(uint **)((long)a + 0x18);
            uVar4 = *(ulong *)((long)a + 0x30);
            if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
              uVar5 = *puVar3;
              uVar7 = (ulong)uVar5;
              puVar1 = puVar3 + 1;
              *(uint **)((long)a + 0x18) = puVar1;
              pcVar6 = (char *)realloc(pcVar6,uVar7);
              if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                memcpy(pcVar6,puVar1,uVar7);
                *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                b2 = (uint8_t *)malloc(__size);
                uVar5 = LZ4_decompress_safe(pcVar6,(char *)b2,uVar5,nr_of_indices);
                if (uVar5 != nr_of_indices) {
                  __assert_fail("bytes_decompressed == nr_of_attribs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                ,0x63c,"int trico_read_attributes_uint64(void *, uint64_t **)");
                }
                if (*(int *)((long)a + 0x40) == 0) {
                  lVar2 = *(long *)((long)a + 0x10);
                  puVar3 = *(uint **)((long)a + 0x18);
                  uVar4 = *(ulong *)((long)a + 0x30);
                  if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                    uVar5 = *puVar3;
                    uVar7 = (ulong)uVar5;
                    puVar1 = puVar3 + 1;
                    *(uint **)((long)a + 0x18) = puVar1;
                    pcVar6 = (char *)realloc(pcVar6,uVar7);
                    if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                      memcpy(pcVar6,puVar1,uVar7);
                      *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                      b3 = (uint8_t *)malloc(__size);
                      uVar5 = LZ4_decompress_safe(pcVar6,(char *)b3,uVar5,nr_of_indices);
                      if (uVar5 != nr_of_indices) {
                        __assert_fail("bytes_decompressed == nr_of_attribs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x645,"int trico_read_attributes_uint64(void *, uint64_t **)"
                                     );
                      }
                      if (*(int *)((long)a + 0x40) == 0) {
                        lVar2 = *(long *)((long)a + 0x10);
                        puVar3 = *(uint **)((long)a + 0x18);
                        uVar4 = *(ulong *)((long)a + 0x30);
                        if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                          uVar5 = *puVar3;
                          uVar7 = (ulong)uVar5;
                          puVar1 = puVar3 + 1;
                          *(uint **)((long)a + 0x18) = puVar1;
                          pcVar6 = (char *)realloc(pcVar6,uVar7);
                          if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                            memcpy(pcVar6,puVar1,uVar7);
                            *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                            b4 = (uint8_t *)malloc(__size);
                            uVar5 = LZ4_decompress_safe(pcVar6,(char *)b4,uVar5,nr_of_indices);
                            if (uVar5 != nr_of_indices) {
                              __assert_fail("bytes_decompressed == nr_of_attribs",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                            ,0x64e,
                                            "int trico_read_attributes_uint64(void *, uint64_t **)")
                              ;
                            }
                            if (*(int *)((long)a + 0x40) == 0) {
                              lVar2 = *(long *)((long)a + 0x10);
                              puVar3 = *(uint **)((long)a + 0x18);
                              uVar4 = *(ulong *)((long)a + 0x30);
                              if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                                uVar5 = *puVar3;
                                uVar7 = (ulong)uVar5;
                                puVar1 = puVar3 + 1;
                                *(uint **)((long)a + 0x18) = puVar1;
                                pcVar6 = (char *)realloc(pcVar6,uVar7);
                                if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                                  memcpy(pcVar6,puVar1,uVar7);
                                  *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                                  b5 = (uint8_t *)malloc(__size);
                                  uVar5 = LZ4_decompress_safe(pcVar6,(char *)b5,uVar5,nr_of_indices)
                                  ;
                                  if (uVar5 != nr_of_indices) {
                                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x657,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                 );
                                  }
                                  if (*(int *)((long)a + 0x40) == 0) {
                                    lVar2 = *(long *)((long)a + 0x10);
                                    puVar3 = *(uint **)((long)a + 0x18);
                                    uVar4 = *(ulong *)((long)a + 0x30);
                                    if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                                      uVar5 = *puVar3;
                                      uVar7 = (ulong)uVar5;
                                      puVar1 = puVar3 + 1;
                                      *(uint **)((long)a + 0x18) = puVar1;
                                      pcVar6 = (char *)realloc(pcVar6,uVar7);
                                      if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                                        memcpy(pcVar6,puVar1,uVar7);
                                        *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                                        b6 = (uint8_t *)malloc(__size);
                                        uVar5 = LZ4_decompress_safe(pcVar6,(char *)b6,uVar5,
                                                                    nr_of_indices);
                                        if (uVar5 != nr_of_indices) {
                                          __assert_fail("bytes_decompressed == nr_of_attribs",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x660,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                  );
                                        }
                                        if (*(int *)((long)a + 0x40) == 0) {
                                          lVar2 = *(long *)((long)a + 0x10);
                                          puVar3 = *(uint **)((long)a + 0x18);
                                          uVar4 = *(ulong *)((long)a + 0x30);
                                          if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                                            uVar5 = *puVar3;
                                            uVar7 = (ulong)uVar5;
                                            puVar1 = puVar3 + 1;
                                            *(uint **)((long)a + 0x18) = puVar1;
                                            pcVar6 = (char *)realloc(pcVar6,uVar7);
                                            if ((long)puVar3 + ((uVar7 + 4) - lVar2) <= uVar4) {
                                              memcpy(pcVar6,puVar1,uVar7);
                                              *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                                              b7 = (uint8_t *)malloc(__size);
                                              uVar5 = LZ4_decompress_safe(pcVar6,(char *)b7,uVar5,
                                                                          nr_of_indices);
                                              if (uVar5 != nr_of_indices) {
                                                __assert_fail("bytes_decompressed == nr_of_attribs",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x669,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                  );
                                              }
                                              if (*(int *)((long)a + 0x40) == 0) {
                                                lVar2 = *(long *)((long)a + 0x10);
                                                puVar3 = *(uint **)((long)a + 0x18);
                                                uVar4 = *(ulong *)((long)a + 0x30);
                                                if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
                                                  uVar5 = *puVar3;
                                                  uVar7 = (ulong)uVar5;
                                                  puVar1 = puVar3 + 1;
                                                  *(uint **)((long)a + 0x18) = puVar1;
                                                  pcVar6 = (char *)realloc(pcVar6,uVar7);
                                                  if (uVar4 < (long)puVar3 + ((uVar7 + 4) - lVar2))
                                                  {
                                                    return 0;
                                                  }
                                                  memcpy(pcVar6,puVar1,uVar7);
                                                  *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                                                  b8 = (uint8_t *)malloc(__size);
                                                  uVar5 = LZ4_decompress_safe(pcVar6,(char *)b8,
                                                                              uVar5,nr_of_indices);
                                                  if (uVar5 != nr_of_indices) {
                                                    __assert_fail(
                                                  "bytes_decompressed == nr_of_attribs",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                                  ,0x672,
                                                  "int trico_read_attributes_uint64(void *, uint64_t **)"
                                                  );
                                                  }
                                                  if (attrib != (uint64_t **)0x0) {
                                                    trico_transpose_uint64_soa_to_aos
                                                              (attrib,b1,b2,b3,b4,b5,b6,b7,b8,
                                                               nr_of_indices);
                                                  }
                                                  free(pcVar6);
                                                  free(b1);
                                                  free(b2);
                                                  free(b3);
                                                  free(b4);
                                                  free(b5);
                                                  free(b6);
                                                  free(b7);
                                                  free(b8);
                                                  read_next_stream_type((trico_archive *)a);
                                                  return 1;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int trico_read_attributes_uint64(void* a, uint64_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;

  if (trico_get_next_stream_type(arch) != trico_attribute_uint64_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b5 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b5, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b6 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b6, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b7 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b7, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b8 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b8, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint64_soa_to_aos(attrib, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, decompressed_b5, decompressed_b6, decompressed_b7, decompressed_b8, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);
  trico_free(decompressed_b5);
  trico_free(decompressed_b6);
  trico_free(decompressed_b7);
  trico_free(decompressed_b8);

  read_next_stream_type(arch);

  return 1;
  }